

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O1

char * prepbuffsize(luaL_Buffer *B,size_t sz,int boxidx)

{
  ulong uVar1;
  lua_State *L;
  ulong uVar2;
  int iVar3;
  char *pcVar4;
  undefined8 *puVar5;
  ulong newsize;
  
  uVar1 = B->n;
  if (B->size - uVar1 < sz) {
    L = B->L;
    if (CARRY8(sz,uVar1)) {
      iVar3 = luaL_error(L,"buffer too large");
      newsize = (ulong)iVar3;
    }
    else {
      uVar2 = (B->size >> 1) * 3;
      newsize = sz + uVar1;
      if (sz + uVar1 < uVar2) {
        newsize = uVar2;
      }
    }
    if ((anon_union_1024_6_fd43c7cc_for_init *)B->b == &B->init) {
      lua_rotate(L,boxidx,-1);
      lua_settop(L,-2);
      puVar5 = (undefined8 *)lua_newuserdatauv(L,0x10,0);
      *puVar5 = 0;
      puVar5[1] = 0;
      iVar3 = luaL_newmetatable(L,"_UBOX*");
      if (iVar3 != 0) {
        luaL_setfuncs(L,boxmt,0);
      }
      lua_setmetatable(L,-2);
      lua_rotate(L,boxidx,1);
      lua_toclose(L,boxidx);
      pcVar4 = (char *)resizebox(L,boxidx,newsize);
      memcpy(pcVar4,B->b,B->n);
    }
    else {
      pcVar4 = (char *)resizebox(L,boxidx,newsize);
    }
    B->b = pcVar4;
    B->size = newsize;
    pcVar4 = pcVar4 + B->n;
  }
  else {
    pcVar4 = B->b + uVar1;
  }
  return pcVar4;
}

Assistant:

static char *prepbuffsize (luaL_Buffer *B, size_t sz, int boxidx) {
  checkbufferlevel(B, boxidx);
  if (B->size - B->n >= sz)  /* enough space? */
    return B->b + B->n;
  else {
    lua_State *L = B->L;
    char *newbuff;
    size_t newsize = newbuffsize(B, sz);
    /* create larger buffer */
    if (buffonstack(B))  /* buffer already has a box? */
      newbuff = (char *)resizebox(L, boxidx, newsize);  /* resize it */
    else {  /* no box yet */
      lua_remove(L, boxidx);  /* remove placeholder */
      newbox(L);  /* create a new box */
      lua_insert(L, boxidx);  /* move box to its intended position */
      lua_toclose(L, boxidx);
      newbuff = (char *)resizebox(L, boxidx, newsize);
      memcpy(newbuff, B->b, B->n * sizeof(char));  /* copy original content */
    }
    B->b = newbuff;
    B->size = newsize;
    return newbuff + B->n;
  }
}